

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O2

int parseAdvance(mpt_iterator *ptr)

{
  mpt_iterator *pmVar1;
  _mpt_vptr_iterator *__s;
  _mpt_vptr_iterator *p_Var2;
  void *pvVar3;
  size_t __n;
  int iVar4;
  
  if (ptr[6]._vptr == (_mpt_vptr_iterator *)0x0) {
    iVar4 = -0x10;
  }
  else {
    __s = ptr[5]._vptr;
    if (__s == (_mpt_vptr_iterator *)0x0) {
      ptr[6]._vptr = (_mpt_vptr_iterator *)0x0;
    }
    else {
      pmVar1 = ptr + 5;
      __n = (long)ptr[6]._vptr - (long)__s;
      if (__n != 0) {
        p_Var2 = ptr[7]._vptr;
        if (p_Var2 == (_mpt_vptr_iterator *)0x0) {
          pvVar3 = memchr(__s,0,__n);
          if (pvVar3 == (void *)0x0) {
            pmVar1->_vptr = (_mpt_vptr_iterator *)0x0;
            return 0;
          }
          pmVar1->_vptr = (_mpt_vptr_iterator *)((long)pvVar3 + 1);
        }
        else {
          ptr[5]._vptr = (_mpt_vptr_iterator *)((long)&p_Var2->value + 1);
          *(undefined1 *)&p_Var2->value = *(undefined1 *)&ptr[8]._vptr;
          ptr[7]._vptr = (_mpt_vptr_iterator *)0x0;
        }
        return 0x73;
      }
      pmVar1->_vptr = (_mpt_vptr_iterator *)0x0;
      ptr[6]._vptr = (_mpt_vptr_iterator *)0x0;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int parseAdvance(MPT_INTERFACE(iterator) *ptr)
{
	MPT_STRUCT(parseIterator) *it = MPT_baseaddr(parseIterator, ptr, _it);
	char *next;
	size_t len;
	
	if (!it->end) {
		return MPT_ERROR(MissingData);
	}
	if (!it->val) {
		it->end = 0;
		return 0;
	}
	len = it->end - it->val;
	if (!(len = it->end - it->val)) {
		it->val = 0;
		it->end = 0;
		return 0;
	}
	if (it->restore) {
		it->val = it->restore + 1;
		*it->restore = it->save;
		it->restore = 0;
	}
	else if ((next = memchr(it->val, 0, len))) {
		it->val = next + 1;
	}
	else {
		it->val = 0;
		return 0;
	}
	return 's';
}